

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
BuildingInfoIRCCommand::trigger
          (BuildingInfoIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  Server *pSVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  long lVar6;
  reference ppSVar7;
  reference this_00;
  pointer pBVar8;
  _If_sv<std::basic_string_view<char>,_size_type> _Var9;
  reference pvVar10;
  char *pcVar11;
  size_t sVar12;
  __sv_type _Var13;
  basic_string_view<char,_std::char_traits<char>_> bVar14;
  size_t local_1c8;
  char *local_1c0;
  size_t local_1a8;
  char *local_1a0;
  size_t local_188;
  char *local_180;
  size_t local_168;
  char *local_160;
  size_t local_148;
  char *local_140;
  allocator<char> local_121;
  string_view local_120;
  undefined1 local_110 [8];
  string str;
  unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_> *building;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>
  *__range3;
  Server **server;
  iterator __end1;
  iterator __begin1;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> local_98 [24];
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *local_80;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *__range1;
  forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cStrings;
  forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oStrings;
  forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nStrings;
  forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  gStrings;
  bool foundServer;
  bool seenStrip;
  int type;
  Channel *chan;
  IRC_Bot *source_local;
  BuildingInfoIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  pcVar11 = channel._M_str;
  sVar12 = channel._M_len;
  lVar6 = Jupiter::IRC::Client::getChannel(source,sVar12,pcVar11);
  if (lVar6 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    bVar2 = false;
    std::
    forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::forward_list(&nStrings);
    std::
    forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::forward_list(&oStrings);
    std::
    forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::forward_list(&cStrings);
    std::
    forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::forward_list((forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
    RenX::getCore();
    RenX::Core::getServers();
    local_80 = local_98;
    __end1 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::begin(local_80);
    server = (Server **)std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::end(local_80);
    while (bVar3 = __gnu_cxx::
                   operator==<RenX::Server_**,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                             (&__end1,(__normal_iterator<RenX::Server_**,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                                       *)&server), ((bVar3 ^ 0xffU) & 1) != 0) {
      ppSVar7 = __gnu_cxx::
                __normal_iterator<RenX::Server_**,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                ::operator*(&__end1);
      bVar4 = RenX::Server::isLogChanType((int)*ppSVar7);
      if ((bVar4 & 1) != 0) {
        bVar2 = true;
        bVar3 = false;
        pSVar1 = *ppSVar7;
        __end3 = std::
                 vector<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>
                 ::begin((vector<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>
                          *)(pSVar1 + 0x28));
        building = (unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_> *)
                   std::
                   vector<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>
                   ::end((vector<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>
                          *)(pSVar1 + 0x28));
        while (bVar5 = __gnu_cxx::
                       operator==<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_*,_std::vector<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>_>
                                 (&__end3,(__normal_iterator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_*,_std::vector<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>_>
                                           *)&building), ((bVar5 ^ 0xffU) & 1) != 0) {
          this_00 = __gnu_cxx::
                    __normal_iterator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_*,_std::vector<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>_>
                    ::operator*(&__end3);
          pBVar8 = std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>::
                   operator->(this_00);
          join_0x00000010_0x00000000_ = sv("Rx_Building_Air",0xf);
          _Var9 = std::__cxx11::string::find<std::basic_string_view<char,std::char_traits<char>>>
                            ((string *)pBVar8,
                             (basic_string_view<char,_std::char_traits<char>_> *)
                             ((long)&str.field_2 + 8),0);
          if (_Var9 == 0) {
            if (!bVar3) {
              bVar3 = true;
              goto LAB_0014441c;
            }
          }
          else {
LAB_0014441c:
            local_120 = RenX_CommandsPlugin::getBuildingInfoFormat(&pluginInstance);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      ((string *)local_110,&local_120,&local_121);
            std::allocator<char>::~allocator(&local_121);
            pSVar1 = *ppSVar7;
            pBVar8 = std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>::
                     get(this_00);
            RenX::processTags((string *)local_110,pSVar1,(PlayerInfo *)0x0,(PlayerInfo *)0x0,pBVar8)
            ;
            pBVar8 = std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>::
                     operator->(this_00);
            if ((pBVar8->capturable & 1U) == 0) {
              pBVar8 = std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>
                       ::operator->(this_00);
              if (pBVar8->team == GDI) {
                std::
                forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_front(&nStrings,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_110);
              }
              else {
                pBVar8 = std::
                         unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>::
                         operator->(this_00);
                if (pBVar8->team == Nod) {
                  std::
                  forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_front(&oStrings,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_110);
                }
                else {
                  std::
                  forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_front(&cStrings,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_110);
                }
              }
            }
            else {
              std::
              forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_front((forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_110);
            }
            std::__cxx11::string::~string((string *)local_110);
          }
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_*,_std::vector<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>_>
          ::operator++(&__end3);
        }
        while (bVar3 = std::
                       forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::empty(&nStrings), !bVar3) {
          std::
          forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_front(&nStrings);
          pvVar10 = std::
                    forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::front(&nStrings);
          _Var13 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar10);
          local_148 = _Var13._M_len;
          local_140 = _Var13._M_str;
          Jupiter::IRC::Client::sendMessage(source,sVar12,pcVar11,local_148,local_140);
        }
        while (bVar3 = std::
                       forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::empty(&oStrings), !bVar3) {
          std::
          forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_front(&oStrings);
          pvVar10 = std::
                    forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::front(&oStrings);
          _Var13 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar10);
          local_168 = _Var13._M_len;
          local_160 = _Var13._M_str;
          Jupiter::IRC::Client::sendMessage(source,sVar12,pcVar11,local_168,local_160);
        }
        while (bVar3 = std::
                       forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::empty(&cStrings), !bVar3) {
          std::
          forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_front(&cStrings);
          pvVar10 = std::
                    forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::front(&cStrings);
          _Var13 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar10);
          local_188 = _Var13._M_len;
          local_180 = _Var13._M_str;
          Jupiter::IRC::Client::sendMessage(source,sVar12,pcVar11,local_188,local_180);
        }
        while (bVar3 = std::
                       forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::empty((forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&__range1), !bVar3) {
          std::
          forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_front((forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range1);
          pvVar10 = std::
                    forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::front((forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&__range1);
          _Var13 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar10);
          local_1a8 = _Var13._M_len;
          local_1a0 = _Var13._M_str;
          Jupiter::IRC::Client::sendMessage(source,sVar12,pcVar11,local_1a8,local_1a0);
        }
      }
      __gnu_cxx::
      __normal_iterator<RenX::Server_**,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
      ::operator++(&__end1);
    }
    std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~vector(local_98);
    if (!bVar2) {
      bVar14 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
      local_1c8 = bVar14._M_len;
      local_1c0 = bVar14._M_str;
      Jupiter::IRC::Client::sendMessage(source,sVar12,pcVar11,local_1c8,local_1c0);
    }
    std::
    forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~forward_list((forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range1);
    std::
    forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~forward_list(&cStrings);
    std::
    forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~forward_list(&oStrings);
    std::
    forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~forward_list(&nStrings);
  }
  return;
}

Assistant:

void BuildingInfoIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	int type = chan->getType();
	bool seenStrip;
	bool foundServer{};
	std::forward_list<std::string> gStrings;
	std::forward_list<std::string> nStrings;
	std::forward_list<std::string> oStrings;
	std::forward_list<std::string> cStrings;
	for (const auto& server : RenX::getCore()->getServers()) {
		if (server->isLogChanType(type)) {
			foundServer = true;
			seenStrip = false;
			for (const auto& building : server->buildings){
				if (building->name.find("Rx_Building_Air"sv) == 0) {
					if (seenStrip) {
						continue;
					}

					seenStrip = true;
				}
				std::string str(pluginInstance.getBuildingInfoFormat());
				RenX::processTags(str, server, nullptr, nullptr, building.get());

				if (building->capturable)
					cStrings.push_front(str);
				else if (building->team == RenX::TeamType::GDI)
					gStrings.push_front(str);
				else if (building->team == RenX::TeamType::Nod)
					nStrings.push_front(str);
				else
					oStrings.push_front(str);
			}

			while (gStrings.empty() == false) {
				gStrings.pop_front();
				source->sendMessage(channel, gStrings.front());
			}
			while (nStrings.empty() == false) {
				nStrings.pop_front();
				source->sendMessage(channel, nStrings.front());
			}
			while (oStrings.empty() == false) {
				oStrings.pop_front();
				source->sendMessage(channel, oStrings.front());
			}
			while (cStrings.empty() == false) {
				cStrings.pop_front();
				source->sendMessage(channel, cStrings.front());
			}
		}
	}

	if (!foundServer) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
	}
}